

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
xLearn::FFMParser::Parse(FFMParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  byte bVar2;
  index_t iVar3;
  index_t iVar4;
  uint64 uVar5;
  char *pcVar6;
  char *pcVar7;
  char *__nptr;
  ostream *poVar8;
  DMatrix *this_00;
  index_t row_id;
  float feat_val;
  double dVar9;
  float local_a4;
  allocator local_9e;
  allocator local_9d;
  Logger local_9c;
  char *local_98;
  uint64 local_90;
  long local_88;
  uint64 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  local_78 = buf;
  if (buf == (char *)0x0) {
    local_9c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
               ,&local_9d);
    std::__cxx11::string::string((string *)&local_70,"Parse",&local_9e);
    poVar8 = Logger::Start(ERR,&local_50,0x8b,&local_70);
    poVar8 = std::operator<<(poVar8,"CHECK failed ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x8b);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"buf");
    std::operator<<(poVar8," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        this_00 = matrix;
        DMatrix::Reset(matrix);
      }
      local_90 = 0;
      local_80 = size;
      while( true ) {
        uVar5 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_78,local_90,local_80);
        if (uVar5 == 0) break;
        DMatrix::AddRow(matrix);
        bVar2 = (this->super_Parser).has_label_;
        row_id = matrix->row_length - 1;
        local_88 = (long)(int)row_id;
        if ((bool)bVar2 == true) {
          pcVar6 = strtok(line_buf,(this->super_Parser).splitor_._M_dataplus._M_p);
          dVar9 = atof(pcVar6);
          (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_88] = (float)dVar9;
          bVar2 = (this->super_Parser).has_label_;
        }
        else {
          (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_88] = -2.0;
        }
        local_a4 = 0.0;
        if ((bVar2 & 1) == 0) {
          local_98 = strtok(line_buf,":");
          pcVar6 = strtok((char *)0x0,":");
          pcVar7 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
          if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\n')) {
            iVar3 = atoi(pcVar6);
            dVar9 = atof(pcVar7);
            feat_val = (float)dVar9;
            iVar4 = atoi(local_98);
            DMatrix::AddNode(matrix,row_id,iVar3,feat_val,iVar4);
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)feat_val),ZEXT416((uint)feat_val),ZEXT416(0));
            local_a4 = auVar1._0_4_;
          }
        }
        local_90 = local_90 + uVar5;
        while( true ) {
          pcVar6 = strtok((char *)0x0,":");
          pcVar7 = strtok((char *)0x0,":");
          this_00 = (DMatrix *)0x0;
          __nptr = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
          if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\n')) break;
          iVar3 = atoi(pcVar7);
          dVar9 = atof(__nptr);
          local_98 = (char *)CONCAT44(local_98._4_4_,(float)dVar9);
          iVar4 = atoi(pcVar6);
          DMatrix::AddNode(matrix,row_id,iVar3,local_98._0_4_,iVar4);
          auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_a4),ZEXT416((uint)local_98._0_4_),
                                   ZEXT416((uint)local_98._0_4_));
          local_a4 = auVar1._0_4_;
        }
        (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[local_88] = 1.0 / local_a4;
      }
      return;
    }
    local_9c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
               ,&local_9d);
    std::__cxx11::string::string((string *)&local_70,"Parse",&local_9e);
    poVar8 = Logger::Start(ERR,&local_50,0x8c,&local_70);
    poVar8 = std::operator<<(poVar8,"CHECK_GT failed ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x8c);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"size");
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"0");
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
    std::operator<<(poVar8,"\n");
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_9c);
  abort();
}

Assistant:

void FFMParser::Parse(char* buf, 
                      uint64 size, 
                      DMatrix& matrix,
                      bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *field_char = strtok(line_buf, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        index_t field_id = atoi(field_char);
        matrix.AddNode(i, idx, value, field_id);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *field_char = strtok(nullptr, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (field_char == nullptr || *field_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      index_t field_id = atoi(field_char);
      matrix.AddNode(i, idx, value, field_id);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}